

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O2

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,string *v)

{
  size_t size;
  
  size = v->_M_string_length;
  detail::check_container_size<8ul>(size);
  packer<msgpack::v1::sbuffer>::pack_str(o,(uint32_t)size);
  packer<msgpack::v1::sbuffer>::append_buffer(o,(v->_M_dataplus)._M_p,size & 0xffffffff);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const std::string& v) const {
        uint32_t size = checked_get_container_size(v.size());
        o.pack_str(size);
        o.pack_str_body(v.data(), size);
        return o;
    }